

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O3

void NGA_Access_ghosts64(int g_a,int64_t *dims,void *ptr,int64_t *ld)

{
  Integer IVar1;
  long lVar2;
  Integer *ld_00;
  Integer *dims_00;
  Integer _ga_work [7];
  Integer _ga_lo [7];
  Integer local_a8 [8];
  Integer local_68 [7];
  
  IVar1 = pnga_ndim((long)g_a);
  dims_00 = local_68;
  ld_00 = local_a8;
  pnga_access_ghost_ptr((long)g_a,dims_00,ptr,ld_00);
  lVar2 = IVar1;
  if (1 < IVar1) {
    do {
      ld[lVar2 + -2] = *ld_00;
      lVar2 = lVar2 + -1;
      ld_00 = ld_00 + 1;
    } while (lVar2 != 1);
  }
  if (0 < IVar1) {
    do {
      dims[IVar1 + -1] = *dims_00;
      dims_00 = dims_00 + 1;
      IVar1 = IVar1 + -1;
    } while (IVar1 != 0);
  }
  return;
}

Assistant:

void NGA_Access_ghosts64(int g_a, int64_t dims[], void *ptr, int64_t ld[])
{
     Integer a=(Integer)g_a;
     Integer ndim = wnga_ndim(a);
     Integer _ga_lo[MAXDIM];
     Integer _ga_work[MAXDIM];

     wnga_access_ghost_ptr(a, _ga_lo, ptr, _ga_work);
     COPYF2C_64(_ga_work,ld, ndim-1);
     COPYF2C_64(_ga_lo, dims, ndim);
}